

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Block::Block(Block *this,Relooper *relooper,Expression *CodeInit,
                 Expression *SwitchConditionInit)

{
  Expression *SwitchConditionInit_local;
  Expression *CodeInit_local;
  Relooper *relooper_local;
  Block *this_local;
  
  this->relooper = relooper;
  ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::InsertOrderedMap(&this->BranchesOut);
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet(&this->BranchesIn);
  ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::InsertOrderedMap
            (&this->ProcessedBranchesOut);
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet(&this->ProcessedBranchesIn);
  this->Parent = (Shape *)0x0;
  this->Id = -1;
  this->Code = CodeInit;
  this->SwitchCondition = SwitchConditionInit;
  this->IsCheckedMultipleEntry = false;
  return;
}

Assistant:

Block::Block(Relooper* relooper,
             wasm::Expression* CodeInit,
             wasm::Expression* SwitchConditionInit)
  : relooper(relooper), Code(CodeInit), SwitchCondition(SwitchConditionInit),
    IsCheckedMultipleEntry(false) {}